

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  _Map_pointer pppSVar1;
  bool bVar2;
  double dVar3;
  
  if ((this->tokens_ == (TokenPool *)0x0) &&
     (pppSVar1 = *(_Map_pointer *)
                  ((long)&(this->subprocs_).finished_.c.
                          super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                          super__Deque_impl_data._M_finish + 0x18),
     *(int *)(this->config_ + 8) <=
     (int)((int)((ulong)((long)*(_Elt_pointer *)
                                ((long)&(this->subprocs_).finished_.c.
                                        super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                        ._M_impl.super__Deque_impl_data._M_start + 0x10) -
                        (long)(this->subprocs_).finished_.c.
                              super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
                              .super__Deque_impl_data._M_start._M_cur) >> 3) +
           (int)((ulong)((long)(this->subprocs_).finished_.c.
                               super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)*(_Elt_pointer *)
                               ((long)&(this->subprocs_).finished_.c.
                                       super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish + 8)) >> 3) +
           (int)((ulong)((long)(this->subprocs_).running_.
                               super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->subprocs_).running_.
                              super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) +
          ((((uint)((int)pppSVar1 -
                   *(int *)((long)&(this->subprocs_).finished_.c.
                                   super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                   _M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
          (uint)(pppSVar1 == (_Map_pointer)0x0)) * 0x40))) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (((this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (0.0 < this->max_load_average_)) {
      dVar3 = GetLoadAverage();
      bVar2 = dVar3 < this->max_load_average_;
    }
  }
  return bVar2;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  bool parallelism_limit_not_reached =
    tokens_ || // ignore config_.parallelism
    ((int) (subprocs_.running_.size() +
            subprocs_.finished_.size()) < config_.parallelism);
  return parallelism_limit_not_reached
    && (subprocs_.running_.empty() ||
        (max_load_average_ <= 0.0f ||
         GetLoadAverage() < max_load_average_));
}